

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol(DescriptorPool *this,string *symbol_name)

{
  bool bVar1;
  Tables *pTVar2;
  FileDescriptor *pFVar3;
  Symbol SVar4;
  MutexLockMaybe lock;
  MutexLockMaybe MStack_38;
  Symbol local_30;
  
  internal::MutexLockMaybe::MutexLockMaybe(&MStack_38,this->mutex_);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  SVar4 = Tables::FindSymbol(pTVar2,symbol_name);
  local_30.field_1 = SVar4.field_1;
  local_30.type = SVar4.type;
  if (local_30.type == NULL_SYMBOL) {
    if (this->underlay_ != (DescriptorPool *)0x0) {
      pFVar3 = FindFileContainingSymbol(this->underlay_,symbol_name);
      if (pFVar3 != (FileDescriptor *)0x0) goto LAB_001dd333;
    }
    bVar1 = TryFindSymbolInFallbackDatabase(this,symbol_name);
    if (bVar1) {
      pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                         (&this->tables_);
      SVar4 = Tables::FindSymbol(pTVar2,symbol_name);
      local_30.field_1 = SVar4.field_1;
      local_30.type = SVar4.type;
      if (local_30.type != NULL_SYMBOL) goto LAB_001dd326;
    }
    pFVar3 = (FileDescriptor *)0x0;
  }
  else {
LAB_001dd326:
    pFVar3 = anon_unknown_1::Symbol::GetFile(&local_30);
  }
LAB_001dd333:
  internal::MutexLockMaybe::~MutexLockMaybe(&MStack_38);
  return pFVar3;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    const string& symbol_name) const {
  MutexLockMaybe lock(mutex_);
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != NULL) {
    const FileDescriptor* file_result =
      underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != NULL) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return NULL;
}